

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
* __thiscall
google::
dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
::insert_noresize<int&,int&,int>
          (pair<google::dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_bool>
           *__return_storage_ptr__,
          dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
          *this,int *key,int *args,int *args_1)

{
  long lVar1;
  long lVar2;
  unsigned_long uVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  pVar4 = dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          ::find_position<int>
                    ((dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)this,key);
  uVar3 = pVar4.first;
  if (uVar3 == 0xffffffffffffffff) {
    insert_at<int&,int>(&__return_storage_ptr__->first,this,pVar4.second,args,args_1);
  }
  else {
    lVar1 = *(long *)(this + 0x38);
    lVar2 = *(long *)(this + 0x48);
    (__return_storage_ptr__->first).ht =
         (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)this;
    (__return_storage_ptr__->first).pos = (pointer)(lVar2 + uVar3 * 8);
    (__return_storage_ptr__->first).end = (pointer)(lVar2 + lVar1 * 8);
  }
  __return_storage_ptr__->second = uVar3 == 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }